

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O2

uint TA_STOCH_FramePPLB(TA_ParamHolderPriv *params)

{
  TA_ParamHolderOptInput *pTVar1;
  uint uVar2;
  
  pTVar1 = params->optIn;
  uVar2 = TA_STOCH_Lookback((pTVar1->data).optInInteger,pTVar1[1].data.optInInteger,
                            pTVar1[2].data.optInInteger,pTVar1[3].data.optInInteger,
                            pTVar1[4].data.optInInteger);
  return uVar2;
}

Assistant:

unsigned int TA_STOCH_FramePPLB( const TA_ParamHolderPriv *params )
/* Generated */ {
/* Generated */    return TA_STOCH_Lookback(params->optIn[0].data.optInInteger, /* optInFastK_Period*/
/* Generated */                       params->optIn[1].data.optInInteger, /* optInSlowK_Period*/
/* Generated */                       (TA_MAType)params->optIn[2].data.optInInteger, /* optInSlowK_MAType*/
/* Generated */                       params->optIn[3].data.optInInteger, /* optInSlowD_Period*/
/* Generated */                       (TA_MAType)params->optIn[4].data.optInInteger /* optInSlowD_MAType*/ );
/* Generated */ }